

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.c
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  long lVar2;
  mpt_config *cfg;
  mpt_path p;
  undefined8 *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_50 = (undefined8 *)0x0;
  local_38 = 0;
  uStack_30 = 0x2e0000;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  mtrace();
  mpt_path_set(&local_48,"env",0xffffffff);
  plVar1 = (long *)mpt_config_global(&local_48);
  (**(code **)*plVar1)(plVar1,0x85,&local_50);
  if (argc != 1) {
    lVar2 = 1;
    do {
      mpt_config_environ(local_50,argv[lVar2],0x5f,0);
      lVar2 = lVar2 + 1;
    } while (argc != (int)lVar2);
  }
  mpt_config_set(local_50,"ls.colors",0,0x2e,0);
  (**(code **)*local_50)(local_50,0,table_print,_stdout);
  (**(code **)(*plVar1 + 8))(plVar1);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	MPT_INTERFACE(metatype) *mt;
	MPT_INTERFACE(config) *cfg = 0;
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	mtrace();
	
	mpt_path_set(&p, "env", -1);
	mt = mpt_config_global(&p);
	MPT_metatype_convert(mt, MPT_ENUM(TypeConfigPtr), &cfg);
	
	for (++argv; --argc; ++argv) {
		mpt_config_environ(cfg, *argv, '_', 0);
	}
	mpt_config_set(cfg, "ls.colors", 0, '.', 0);
	
	cfg->_vptr->query(cfg, 0, table_print, stdout);
	
	mt->_vptr->unref(mt);
	return 0;
}